

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::setTriggeringComponent
          (XMLSchemaDescriptionImpl *this,QName *trigComponent)

{
  MemoryManager *manager;
  QName *this_00;
  QName *trigComponent_local;
  XMLSchemaDescriptionImpl *this_local;
  
  if (this->fTriggeringComponent != (QName *)0x0) {
    if (this->fTriggeringComponent != (QName *)0x0) {
      (*(this->fTriggeringComponent->super_XSerializable)._vptr_XSerializable[1])();
    }
    this->fTriggeringComponent = (QName *)0x0;
  }
  manager = QName::getMemoryManager(trigComponent);
  this_00 = (QName *)XMemory::operator_new(0x48,manager);
  QName::QName(this_00,trigComponent);
  this->fTriggeringComponent = this_00;
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::setTriggeringComponent(QName* const trigComponent)
{ 
    if ( fTriggeringComponent) {
        delete fTriggeringComponent;
        fTriggeringComponent = 0;
    }
    
    fTriggeringComponent = new (trigComponent->getMemoryManager()) QName(*trigComponent); 

}